

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O2

void __thiscall
CorUnix::CSynchCache<CorUnix::CSynchData>::CSynchCache
          (CSynchCache<CorUnix::CSynchData> *this,int iMaxDepth)

{
  (this->m_pHead).m_val = (_USynchCacheStackNode *)0x0;
  (this->m_iDepth).m_val = 0;
  this->m_iMaxDepth = iMaxDepth;
  this->m_iMaxTrackedDepth = 0;
  InternalInitializeCriticalSection(&this->m_cs);
  if (this->m_iMaxDepth < 0) {
    this->m_iMaxDepth = 0;
  }
  return;
}

Assistant:

CSynchCache(int iMaxDepth = MaxDepth) :             
            m_pHead(NULL),
            m_iDepth(0),
            m_iMaxDepth(iMaxDepth)
#ifdef _DEBUG
            ,m_iMaxTrackedDepth(0)
#endif
        { 
            InternalInitializeCriticalSection(&m_cs);
            if (m_iMaxDepth < 0)
            {
                m_iMaxDepth = 0;
            }
        }